

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

void __thiscall registerEntity::test_method(registerEntity *this)

{
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  lazy_ostream *plVar4;
  ExceptionFactory *exception_1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]> local_1c0;
  assertion_result local_1a0;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  allocator<char> local_161;
  string local_160 [136];
  ExceptionFactory *exception;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]> local_c8;
  assertion_result local_a8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  registerEntity *local_10;
  registerEntity *this_local;
  
  local_10 = this;
  psVar3 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"myEntity",&local_31);
  dynamicgraph::FactoryStorage::registerEntity(psVar3,(_func_Entity_ptr_string_ptr *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  psVar3 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"myEntity",&local_69);
  dynamicgraph::FactoryStorage::registerEntity(psVar3,(_func_Entity_ptr_string_ptr *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
               ,0x62);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x2e,&local_90);
    boost::test_tools::assertion_result::assertion_result(&local_a8,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c8,plVar4,(char (*) [21])"Should never happen.");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&exception,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
               ,0x62);
    boost::test_tools::tt_detail::report_assertion(&local_a8,&local_c8,&exception,0x2e,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
    ~lazy_ostream_impl(&local_c8);
    boost::test_tools::assertion_result::~assertion_result(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar3 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"myEntity",&local_161);
  dynamicgraph::FactoryStorage::registerEntity(psVar3,(_func_Entity_ptr_string_ptr *)local_160);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
               ,0x62);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_188);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_178,0x36,&local_188);
    boost::test_tools::assertion_result::assertion_result(&local_1a0,false);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1c0,plVar4,(char (*) [21])"Should never happen.");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&exception_1,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/factory.cpp"
               ,0x62);
    boost::test_tools::tt_detail::report_assertion(&local_1a0,&local_1c0,&exception_1,0x36,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
    ~lazy_ostream_impl(&local_1c0);
    boost::test_tools::assertion_result::~assertion_result(&local_1a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(registerEntity) {
  dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                              &makeEntity);

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity",
                                                                &makeEntity);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }

  try {
    dynamicgraph::FactoryStorage::getInstance()->registerEntity("myEntity", 0);
    BOOST_ERROR("Should never happen.");
  } catch (const dynamicgraph::ExceptionFactory &exception) {
    BOOST_CHECK_EQUAL(exception.getCode(),
                      dynamicgraph::ExceptionFactory::OBJECT_CONFLICT);
  }
}